

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memstate.cc
# Opt level: O3

void __thiscall MemoryBank::getChunk(MemoryBank *this,uintb offset,int4 size,uint1 *res)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  
  if (0 < size) {
    iVar6 = 0;
    iVar1 = this->pagesize;
    do {
      uVar5 = offset & (long)-iVar1;
      uVar4 = (int)offset - (int)uVar5;
      uVar3 = this->pagesize - uVar4;
      uVar2 = size - iVar6;
      if ((int)uVar3 <= size - iVar6) {
        uVar2 = uVar3;
      }
      (*this->_vptr_MemoryBank[2])(this,uVar5,res,(ulong)uVar4,(ulong)uVar2);
      iVar6 = iVar6 + uVar2;
      offset = offset + (long)(int)uVar2;
      res = res + (int)uVar2;
    } while (iVar6 < size);
  }
  return;
}

Assistant:

void MemoryBank::getChunk(uintb offset,int4 size,uint1 *res) const

{
  int4 cursize,count;
  uintb pagemask = (uintb) (pagesize-1);
  uintb offalign;
  int4 skip;

  count = 0;
  while(count < size) {
    cursize = pagesize;
    offalign = offset & ~pagemask;
    skip = 0;
    if (offalign != offset) {
      skip = offset-offalign;
      cursize -= skip;
    }
    if (size - count < cursize)
      cursize = size - count;
    getPage(offalign,res,skip,cursize);
    count += cursize;
    offset += cursize;
    res += cursize;
  }
}